

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O0

ztresult_t savehandler_index(char *name,ztindex_t index,void *opaque)

{
  savestate_t *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  savestate_t *state;
  
  if (in_RSI == -1) {
    emitf(in_RDX,"%s = nil;\n",in_RDI);
  }
  else {
    emitf(in_RDX,"%s = %d;\n",in_RDI,in_RSI);
  }
  return 0;
}

Assistant:

static ztresult_t savehandler_index(const char *name,
                                    ztindex_t   index,
                                    void       *opaque)
{
  savestate_t *state = opaque;
  if (index == ULONG_MAX)
    emitf(state, "%s = nil;\n", name);
  else
    emitf(state, "%s = %d;\n", name, index);
  return ztresult_OK;
}